

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
          (View<int,_false,_std::allocator<unsigned_long>_> *this,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  reference pvVar5;
  iterator begin;
  size_type local_50;
  size_t j;
  allocator<unsigned_long> local_31;
  undefined1 local_30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  int n_local;
  View<int,_false,_std::allocator<unsigned_long>_> *this_local;
  
  p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = n;
  testInvariant(this);
  sVar4 = dimension(this);
  marray_detail::Assert<bool>(sVar4 != 0);
  iVar1 = p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  sVar4 = dimension(this);
  iVar2 = p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  iVar3 = -(int)sVar4;
  if ((iVar1 == iVar3 || SBORROW4(iVar1,iVar3) != iVar1 + (int)sVar4 < 0) ||
     (sVar4 = dimension(this),
     iVar3 = p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_, (int)sVar4 <= iVar2)) {
    iVar3 = p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar4 = dimension(this);
    shift(this,iVar3 % (int)sVar4);
  }
  else if (p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ < 1) {
    sVar4 = dimension(this);
    std::allocator<unsigned_long>::allocator(&local_31);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,sVar4,&local_31);
    std::allocator<unsigned_long>::~allocator(&local_31);
    for (local_50 = 0; sVar4 = dimension(this), local_50 < sVar4; local_50 = local_50 + 1) {
      iVar3 = (int)local_50 -
              p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      sVar4 = dimension(this);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,local_50
                         );
      *pvVar5 = (ulong)(long)iVar3 % sVar4;
    }
    begin = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
    View<int,false,std::allocator<unsigned_long>>::
    permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)this,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )begin._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  }
  else {
    sVar4 = dimension(this);
    shift(this,iVar3 - (int)sVar4);
  }
  testInvariant(this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::shift
(
    const int n
) 
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || dimension() != 0);
    if(n <= -static_cast<int>(dimension()) || n >= static_cast<int>(dimension())) {
        shift(n % static_cast<int>(dimension()));
    }
    else {
        if(n > 0) {
            shift(n - static_cast<int>(dimension()));
        }
        else {
            std::vector<std::size_t> p(dimension());
            for(std::size_t j=0; j<dimension(); ++j) {
                p[j] = static_cast<std::size_t>((static_cast<int>(j) - n)) % dimension();
            }
            permute(p.begin());
        }
    }
    testInvariant();
}